

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

void __thiscall DiskTableNode::DiskTableNode(DiskTableNode *this,DiskTableNode *rhs)

{
  Filter *pFVar1;
  
  pFVar1 = rhs->filter;
  this->_sstable = rhs->_sstable;
  this->filter = pFVar1;
  this->index = rhs->index;
  rhs->_sstable = (SSTable *)0x0;
  rhs->filter = (Filter *)0x0;
  rhs->index = (IndexMap *)0x0;
  return;
}

Assistant:

DiskTableNode::DiskTableNode(DiskTableNode &&rhs) noexcept {
    _sstable = rhs._sstable;
    filter = rhs.filter;
    index = rhs.index;
    rhs._sstable = nullptr;
    rhs.filter = nullptr;
    rhs.index = nullptr;
}